

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

double sexp_bignum_to_double(sexp a)

{
  undefined8 uVar1;
  sexp_uint_t sVar2;
  sexp_uint_t sVar3;
  double dVar4;
  
  sVar2 = (a->value).string.offset;
  do {
    sVar3 = sVar2;
    if (sVar3 == 1) goto LAB_00118cb1;
    sVar2 = sVar3 - 1;
  } while (*(long *)((long)&a->value + sVar3 * 8 + 8) == 0);
  if ((long)(sVar3 - 1) < 0) {
    dVar4 = 0.0;
  }
  else {
LAB_00118cb1:
    dVar4 = 0.0;
    do {
      uVar1 = *(undefined8 *)((long)&a->value + sVar3 * 8 + 8);
      dVar4 = dVar4 * 1.8446744073709552e+19 +
              ((double)CONCAT44(0x45300000,(int)((ulong)uVar1 >> 0x20)) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
  }
  return (double)(int)(a->value).flonum_bits[0] * dVar4;
}

Assistant:

double sexp_bignum_to_double (sexp a) {
  double res = 0;
  sexp_sint_t i;
  sexp_uint_t *data=sexp_bignum_data(a);
  for (i=sexp_bignum_hi(a)-1; i>=0; i--)
    res = res * ((double)SEXP_UINT_T_MAX+1) + data[i];
  return res * sexp_bignum_sign(a);
}